

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O2

void __thiscall spdlog::sinks::base_sink<std::mutex>::flush(base_sink<std::mutex> *this)

{
  std::mutex::lock((mutex *)&this->mutex_);
  (*(this->super_sink)._vptr_sink[7])(this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::flush() {
    std::lock_guard<Mutex> lock(mutex_);
    flush_();
}